

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall
MacProj::set_mac_solve_bc
          (MacProj *this,Array<MLLinOp::BCType,_3> *mlmg_lobc,Array<MLLinOp::BCType,_3> *mlmg_hibc,
          BCRec *a_phys_bc,Geometry *geom)

{
  int idim;
  long lVar1;
  LinOpBCType LVar2;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar1 + 0x19) == '\x01') {
      mlmg_lobc->_M_elems[lVar1] = Periodic;
      LVar2 = Periodic;
    }
    else {
      mlmg_lobc->_M_elems[lVar1] = (a_phys_bc->bc[lVar1] != 2) + Dirichlet;
      LVar2 = (a_phys_bc->bc[lVar1 + 3] != 2) + Dirichlet;
    }
    mlmg_hibc->_M_elems[lVar1] = LVar2;
  }
  return;
}

Assistant:

void
MacProj::set_mac_solve_bc (Array<MLLinOp::BCType,AMREX_SPACEDIM>& mlmg_lobc,
			   Array<MLLinOp::BCType,AMREX_SPACEDIM>& mlmg_hibc,
			   const BCRec& a_phys_bc, const Geometry& geom)
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            mlmg_lobc[idim] = MLLinOp::BCType::Periodic;
            mlmg_hibc[idim] = MLLinOp::BCType::Periodic;
        } else {
            if (a_phys_bc.lo(idim) == Outflow) {
                mlmg_lobc[idim] = MLLinOp::BCType::Dirichlet;
            } else {
                mlmg_lobc[idim] = MLLinOp::BCType::Neumann;
            }
            if (a_phys_bc.hi(idim) == Outflow) {
                mlmg_hibc[idim] = MLLinOp::BCType::Dirichlet;
            } else {
                mlmg_hibc[idim] = MLLinOp::BCType::Neumann;
            }
        }
    }
}